

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  float fVar1;
  parser *ppVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined *puVar9;
  vw *pvVar10;
  long *plVar11;
  byte bVar12;
  int iVar13;
  pointer pcVar14;
  ostream *poVar15;
  multi_learner *this;
  typed_option<float> *this_00;
  vw *in_RSI;
  long *in_RDI;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  size_t problem_multiplier;
  option_group_definition new_options;
  string type_string;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  free_ptr<CB_EXPLORE_ADF::cb_explore_adf> data;
  undefined4 in_stack_ffffffffffffe8a8;
  prediction_type_t in_stack_ffffffffffffe8ac;
  vw *in_stack_ffffffffffffe8b0;
  string *in_stack_ffffffffffffe8b8;
  _func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
  *predict;
  typed_option<float> *in_stack_ffffffffffffe8c0;
  single_learner *base_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe8f8;
  option_group_definition *in_stack_ffffffffffffe900;
  allocator *paVar16;
  byte local_169a;
  byte local_1682;
  allocator *l_00;
  allocator local_12e9;
  string local_12e8 [39];
  allocator local_12c1;
  string local_12c0 [39];
  allocator local_1299;
  string local_1298 [39];
  allocator local_1271;
  string local_1270 [39];
  allocator local_1249;
  string local_1248 [37];
  byte local_1223;
  byte local_1222;
  allocator local_1221;
  string local_1220 [39];
  allocator local_11f9;
  string local_11f8 [39];
  allocator local_11d1;
  string local_11d0 [39];
  allocator local_11a9;
  string local_11a8 [32];
  size_t local_1188;
  allocator local_1179;
  string local_1178 [39];
  allocator local_1151;
  string local_1150 [39];
  allocator local_1129;
  string local_1128 [39];
  allocator local_1101;
  string local_1100 [39];
  allocator local_10d9;
  string local_10d8 [32];
  undefined4 local_10b8;
  allocator local_10b1;
  string local_10b0 [39];
  allocator local_1089;
  string local_1088 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1068;
  allocator local_fc1;
  string local_fc0 [39];
  allocator local_f99;
  string local_f98 [32];
  typed_option<float> local_f78;
  allocator local_ed1;
  string local_ed0 [39];
  allocator local_ea9;
  string local_ea8 [32];
  typed_option<bool> local_e88;
  allocator local_de1;
  string local_de0 [39];
  allocator local_db9;
  string local_db8 [32];
  typed_option<float> local_d98;
  allocator local_cf1;
  string local_cf0 [39];
  allocator local_cc9;
  string local_cc8 [32];
  typed_option<float> local_ca8;
  allocator local_c01;
  string local_c00 [39];
  allocator local_bd9;
  string local_bd8 [32];
  typed_option<bool> local_bb8;
  allocator local_b11;
  string local_b10 [39];
  allocator local_ae9;
  string local_ae8 [32];
  typed_option<float> local_ac8;
  allocator local_a21;
  string local_a20 [39];
  allocator local_9f9;
  string local_9f8 [32];
  typed_option<bool> local_9d8;
  allocator local_931;
  string local_930 [39];
  allocator local_909;
  string local_908 [32];
  typed_option<bool> local_8e8;
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [32];
  typed_option<bool> local_7f8;
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  typed_option<bool> local_708;
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [32];
  typed_option<float> local_618;
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [32];
  typed_option<unsigned_long> local_528;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [32];
  typed_option<unsigned_long> local_438;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  typed_option<float> local_348;
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  typed_option<unsigned_long> local_258;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  typed_option<bool> local_168;
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [79];
  allocator local_51;
  string local_50 [37];
  byte local_2b;
  byte local_2a;
  byte local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>();
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"mtr",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"Contextual Bandit Exploration with Action Dependent Features",&local_c1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"cb_explore_adf",&local_189);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_168,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,
             "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
             ,&local_1b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"first",&local_279);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3410cf);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe8b8,(unsigned_long *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<unsigned_long>::keep(&local_258,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"tau-first exploration",&local_2a1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe900,(typed_option<unsigned_long> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"epsilon",&local_369);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3411ba);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_348,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"epsilon-greedy exploration",&local_391);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"bag",&local_459);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3412a5);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe8b8,(unsigned_long *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<unsigned_long>::keep(&local_438,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"bagging-based exploration",&local_481);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe900,(typed_option<unsigned_long> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"cover",&local_549);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341390);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe8b8,(unsigned_long *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<unsigned_long>::keep(&local_528,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"Online cover based exploration",&local_571);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe900,(typed_option<unsigned_long> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"psi",&local_639);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x34147b);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_618,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8c0,(float)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"disagreement parameter for cover",&local_661);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"nounif",&local_729);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341585);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_708,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_750,"do not explore uniformly on zero-probability actions in cover",&local_751);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"softmax",&local_819);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_7f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"softmax exploration",&local_841);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,"regcb",&local_909);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_8e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_930,"RegCB-elim exploration",&local_931);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"regcbopt",&local_9f9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x34182e);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_9d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a20,"RegCB optimistic exploration",&local_a21);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"mellowness",&local_ae9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x34191c);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_ac8,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8c0,(float)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b10,"RegCB mellowness parameter c_0. Default 0.1",&local_b11);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"greedify",&local_bd9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341a29);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_bb8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c00,"always update first policy once in bagging",&local_c01);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc8,"cb_min_cost",&local_cc9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341b17);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_ca8,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8c0,(float)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"lower bound on cost",&local_cf1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_db8,"cb_max_cost",&local_db9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341c1f);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_d98,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8c0,(float)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de0,"upper bound on cost",&local_de1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"first_only",&local_ea9);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341d2c);
  VW::config::make_option<bool>(in_stack_ffffffffffffe8b8,(bool *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<bool>::keep(&local_e88,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ed0,"Only explore the first action in a tie-breaking event",&local_ed1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe900,(typed_option<bool> *)in_stack_ffffffffffffe8f8);
  l_00 = &local_f99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f98,"lambda",l_00);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x341e1a);
  VW::config::make_option<float>(in_stack_ffffffffffffe8b8,(float *)in_stack_ffffffffffffe8b0);
  VW::config::typed_option<float>::keep(&local_f78,true);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffe8c0,(float)((ulong)in_stack_ffffffffffffe8b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc0,"parameter for softmax",&local_fc1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe8b0,
             (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe900,(typed_option<float> *)in_stack_ffffffffffffe8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1088,"cb_type",&local_1089);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe8b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_1068,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_10b0,"contextual bandit method to use in {ips,dr,mtr}. Default: mtr",&local_10b1)
  ;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffe8b0,
       (string *)CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8);
  std::__cxx11::string::~string(local_10b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_1088);
  std::allocator<char>::~allocator((allocator<char> *)&local_1089);
  std::__cxx11::string::~string(local_fc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  std::__cxx11::string::~string(local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  std::__cxx11::string::~string(local_de0);
  std::allocator<char>::~allocator((allocator<char> *)&local_de1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_db8);
  std::allocator<char>::~allocator((allocator<char> *)&local_db9);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_a21);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  (**(code **)*local_10)(local_10,local_a0);
  plVar11 = local_10;
  if ((local_29 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10d8,"cb_type",&local_10d9);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_10d8);
    std::__cxx11::string::~string(local_10d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
    plVar11 = local_10;
    if (((bVar12 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1100,"cb_type",&local_1101);
      (**(code **)(*plVar11 + 0x28))(plVar11,local_1100,local_50);
      std::__cxx11::string::~string(local_1100);
      std::allocator<char>::~allocator((allocator<char> *)&local_1101);
      (**(code **)*local_10)(local_10,local_a0);
    }
    pvVar10 = local_18;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x34335a);
    pcVar14->all = pvVar10;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x343376);
    if (0.0 < pcVar14->lambda) {
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x343393)
      ;
      fVar1 = pcVar14->lambda;
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3433be)
      ;
      pcVar14->lambda = -fVar1;
    }
    plVar11 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1128,"cb_adf",&local_1129);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1128);
    std::__cxx11::string::~string(local_1128);
    std::allocator<char>::~allocator((allocator<char> *)&local_1129);
    plVar11 = local_10;
    if (((bVar12 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1150,"cb_adf",&local_1151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1178,"",&local_1179);
      (**(code **)(*plVar11 + 0x28))(plVar11,local_1150,local_1178);
      std::__cxx11::string::~string(local_1178);
      std::allocator<char>::~allocator((allocator<char> *)&local_1179);
      std::__cxx11::string::~string(local_1150);
      std::allocator<char>::~allocator((allocator<char> *)&local_1151);
    }
    plVar11 = local_10;
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
    local_1188 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11a8,"cover",&local_11a9);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_11a8);
    std::__cxx11::string::~string(local_11a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
    plVar11 = local_10;
    if ((bVar12 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11d0,"bag",&local_11d1);
      bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_11d0);
      std::__cxx11::string::~string(local_11d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
      plVar11 = local_10;
      if ((bVar12 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11f8,"first",&local_11f9);
        bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_11f8);
        std::__cxx11::string::~string(local_11f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_11f9);
        plVar11 = local_10;
        if ((bVar12 & 1) == 0) {
          if ((local_2a & 1) == 0) {
            local_1222 = 0;
            local_1223 = 0;
            local_1682 = 1;
            if ((local_2b & 1) == 0) {
              std::allocator<char>::allocator();
              local_1222 = 1;
              std::__cxx11::string::string(local_1220,"regcbopt",&local_1221);
              local_1223 = 1;
              bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1220);
              local_169a = 0;
              if ((bVar12 & 1) != 0) {
                pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                          operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *
                                     )0x343a10);
                local_169a = pcVar14->regcbopt;
              }
              local_1682 = local_169a;
            }
            if ((local_1223 & 1) != 0) {
              std::__cxx11::string::~string(local_1220);
            }
            if ((local_1222 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_1221);
            }
            plVar11 = local_10;
            if ((local_1682 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1248,"epsilon",&local_1249);
              bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1248);
              std::__cxx11::string::~string(local_1248);
              std::allocator<char>::~allocator((allocator<char> *)&local_1249);
              if (((bVar12 ^ 0xff) & 1) != 0) {
                pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                          operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *
                                     )0x343b9e);
                pcVar14->epsilon = 0.05;
              }
              pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                        operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                   0x343c03);
              pcVar14->explore_type = 1;
            }
            else {
              pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::
                        operator->((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                   0x343a85);
              pcVar14->explore_type = 5;
            }
          }
          else {
            pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                 0x343941);
            pcVar14->explore_type = 3;
          }
        }
        else {
          pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x3438d4);
          pcVar14->explore_type = 0;
        }
      }
      else {
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x3437cc);
        pcVar14->explore_type = 2;
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x3437e1);
        local_1188 = pcVar14->bag_size;
      }
    }
    else {
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3436c0)
      ;
      pcVar14->explore_type = 4;
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x3436d5)
      ;
      local_1188 = pcVar14->cover_size + 1;
    }
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x343c20);
    plVar11 = local_10;
    (pcVar14->gen_cs).cb_type = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1270,"cb_type",&local_1271);
    bVar12 = (**(code **)(*plVar11 + 8))(plVar11,local_1270);
    std::__cxx11::string::~string(local_1270);
    std::allocator<char>::~allocator((allocator<char> *)&local_1271);
    if ((bVar12 & 1) != 0) {
      iVar13 = std::__cxx11::string::compare((char *)local_50);
      if (iVar13 == 0) {
        pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                             0x343ce0);
        (pcVar14->gen_cs).cb_type = 0;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)local_50);
        if (iVar13 == 0) {
          pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x343d5f);
          (pcVar14->gen_cs).cb_type = 2;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)local_50);
          if (iVar13 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1298,"cover",&local_1299);
            bVar12 = (**(code **)(*local_10 + 8))(local_10,local_1298);
            std::__cxx11::string::~string(local_1298);
            std::allocator<char>::~allocator((allocator<char> *)&local_1299);
            if ((bVar12 & 1) != 0) {
              poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                        "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                                       );
              std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
            }
            pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                                ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                                 0x343e9c);
            (pcVar14->gen_cs).cb_type = 3;
          }
          else {
            poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                      "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to mtr."
                                     );
            std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
            paVar16 = &local_12c1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_12c0,"cb_type",paVar16);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_12e8,"mtr",&local_12e9);
            (**(code **)(*local_10 + 0x30))(local_10,local_12c0,local_12e8);
            std::__cxx11::string::~string(local_12e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_12e9);
            std::__cxx11::string::~string(local_12c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_12c1);
          }
        }
      }
      pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x344028)
      ;
      if ((pcVar14->explore_type == 5) &&
         (pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
                               0x34403c), (pcVar14->gen_cs).cb_type != 3)) {
        poVar15 = std::operator<<(&(local_18->trace_message).super_ostream,
                                  "warning: bad cb_type, RegCB only supports mtr!");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
    }
    setup_base((options_i *)in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0);
    LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
    ppVar2 = local_18->p;
    (ppVar2->lp).label_size = DAT_0048fd48;
    puVar9 = PTR_test_label_0048fd40;
    puVar8 = PTR_weight_0048fd30;
    puVar7 = PTR_delete_label_0048fd28;
    puVar6 = PTR_read_cached_label_0048fd20;
    puVar5 = PTR_cache_label_0048fd18;
    puVar4 = PTR_parse_label_0048fd10;
    puVar3 = CB::cb_label;
    (ppVar2->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_0048fd38;
    (ppVar2->lp).test_label = (_func_bool_void_ptr *)puVar9;
    (ppVar2->lp).delete_label = (_func_void_void_ptr *)puVar7;
    (ppVar2->lp).get_weight = (_func_float_void_ptr *)puVar8;
    (ppVar2->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar5;
    (ppVar2->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar6;
    (ppVar2->lp).default_label = (_func_void_void_ptr *)puVar3;
    (ppVar2->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar4;
    local_18->label_type = cb;
    base_00 = local_18->scorer;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x344132);
    (pcVar14->gen_cs).scorer = base_00;
    this = LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
    predict = (_func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
               *)local_28;
    pcVar14 = std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)0x344168);
    pcVar14->cs_ldf_learner = this;
    this_00 = (typed_option<float> *)
              LEARNER::
              init_learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        ((free_ptr<CB_EXPLORE_ADF::cb_explore_adf> *)this,
                         (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                         base_00,(_func_void_cb_explore_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                  *)in_stack_ffffffffffffe8c0,predict,
                         (size_t)in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8ac);
    in_stack_ffffffffffffe8c0 = this_00;
    LEARNER::
    learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)this_00,CB_EXPLORE_ADF::finish_multiline_example);
    LEARNER::
    learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                *)this,(_func_void_cb_explore_adf_ptr *)base_00);
    in_stack_ffffffffffffe8b0 =
         (vw *)LEARNER::
               make_base<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>
                         ((learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
                           *)this_00);
    local_8 = in_stack_ffffffffffffe8b0;
  }
  local_10b8 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe8b0);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)> *)
             in_stack_ffffffffffffe8c0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "mtr";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string)
               .keep()
               .help("contextual bandit method to use in {ips,dr,mtr}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to mtr." << std::endl;
      options.replace("cb_type", "mtr");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}